

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b3fcdf::X509Test_TrustedFirst_Test::TestBody(X509Test_TrustedFirst_Test *this)

{
  void *pvVar1;
  _Head_base<0UL,_evp_pkey_st_*,_false> _Var2;
  _Head_base<0UL,_x509_st_*,_false> _Var3;
  int iVar4;
  ASN1_TIME *s;
  ASN1_TIME *pAVar5;
  EVP_MD *pEVar6;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar7;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<X509> leaf;
  UniquePtr<X509> intermediate;
  UniquePtr<X509> root1_cross;
  UniquePtr<X509> root1;
  UniquePtr<X509> root2;
  AssertHelper local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  undefined1 local_170 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  pointer local_160;
  allocator_type local_152;
  allocator_type local_151;
  string local_150;
  int local_12c;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_128;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_110;
  int local_104;
  _Head_base<0UL,_x509_st_*,_false> local_100;
  _Head_base<0UL,_x509_st_*,_false> local_f8;
  _Head_base<0UL,_x509_st_*,_false> local_f0;
  _Head_base<0UL,_x509_st_*,_false> local_e8;
  _Head_base<0UL,_x509_st_*,_false> local_e0;
  _Head_base<0UL,_x509_st_*,_false> local_d8;
  X509 *local_d0;
  _Head_base<0UL,_x509_st_*,_false> local_c8;
  X509 *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_b3fcdf *)&local_110,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  local_170[0] = (internal)((EVP_PKEY *)local_110._M_head_impl != (EVP_PKEY *)0x0);
  local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((EVP_PKEY *)local_110._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)local_170,(AssertionResult *)0x5e57b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x10b2,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
    }
    if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_168,local_168);
    }
    goto LAB_003c3c3a;
  }
  MakeTestCert((anon_unknown_dwarf_b3fcdf *)&local_e0,"Root 2","Root 2",local_110._M_head_impl,true)
  ;
  local_170[0] = (internal)((X509 *)local_e0._M_head_impl != (X509 *)0x0);
  local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((X509 *)local_e0._M_head_impl == (X509 *)0x0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)local_170,(AssertionResult *)"root2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x10b6,local_150._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
LAB_003c3061:
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
    }
    if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_168,local_168);
    }
  }
  else {
    s = X509_getm_notAfter(local_e0._M_head_impl);
    pAVar5 = ASN1_TIME_adj((ASN1_TIME *)s,0x57e9b680,0,-1);
    _Var3._M_head_impl = local_e0._M_head_impl;
    _Var2._M_head_impl = local_110._M_head_impl;
    local_170[0] = (internal)(pAVar5 != (ASN1_TIME *)0x0);
    local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pAVar5 == (ASN1_TIME *)0x0) {
      testing::Message::Message((Message *)&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_150,(internal *)local_170,
                 (AssertionResult *)
                 "ASN1_TIME_adj(X509_getm_notAfter(root2.get()), kReferenceTime, 0, -1)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x10b9,local_150._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
      goto LAB_003c3061;
    }
    pEVar6 = EVP_sha256();
    iVar4 = X509_sign((X509 *)_Var3._M_head_impl,(EVP_PKEY *)_Var2._M_head_impl,pEVar6);
    local_170[0] = (internal)(iVar4 != 0);
    local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_150,(internal *)local_170,
                 (AssertionResult *)"X509_sign(root2.get(), key.get(), EVP_sha256())","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x10ba,local_150._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
      goto LAB_003c3061;
    }
    MakeTestCert((anon_unknown_dwarf_b3fcdf *)&local_e8,"Root 1","Root 1",local_110._M_head_impl,
                 true);
    _Var3._M_head_impl = local_e8._M_head_impl;
    _Var2._M_head_impl = local_110._M_head_impl;
    local_170[0] = (internal)((X509 *)local_e8._M_head_impl != (X509 *)0x0);
    local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((X509 *)local_e8._M_head_impl == (X509 *)0x0) {
      testing::Message::Message((Message *)&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_150,(internal *)local_170,(AssertionResult *)"root1","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x10be,local_150._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
LAB_003c3177:
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if (local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)(*local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                    _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
      }
      if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_168,local_168);
      }
    }
    else {
      pEVar6 = EVP_sha256();
      iVar4 = X509_sign((X509 *)_Var3._M_head_impl,(EVP_PKEY *)_Var2._M_head_impl,pEVar6);
      local_170[0] = (internal)(iVar4 != 0);
      local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_150,(internal *)local_170,
                   (AssertionResult *)"X509_sign(root1.get(), key.get(), EVP_sha256())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x10bf,local_150._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
        goto LAB_003c3177;
      }
      MakeTestCert((anon_unknown_dwarf_b3fcdf *)&local_f0,"Root 2","Root 1",local_110._M_head_impl,
                   true);
      _Var3._M_head_impl = local_f0._M_head_impl;
      _Var2._M_head_impl = local_110._M_head_impl;
      local_170[0] = (internal)((X509 *)local_f0._M_head_impl != (X509 *)0x0);
      local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((X509 *)local_f0._M_head_impl == (X509 *)0x0) {
        testing::Message::Message((Message *)&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_150,(internal *)local_170,(AssertionResult *)"root1_cross","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x10c3,local_150._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
LAB_003c328d:
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)(*local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
        }
        if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_168,local_168);
        }
      }
      else {
        pEVar6 = EVP_sha256();
        iVar4 = X509_sign((X509 *)_Var3._M_head_impl,(EVP_PKEY *)_Var2._M_head_impl,pEVar6);
        local_170[0] = (internal)(iVar4 != 0);
        local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_150,(internal *)local_170,
                     (AssertionResult *)"X509_sign(root1_cross.get(), key.get(), EVP_sha256())",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x10c4,local_150._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
          goto LAB_003c328d;
        }
        MakeTestCert((anon_unknown_dwarf_b3fcdf *)&local_f8,"Root 1","Intermediate",
                     local_110._M_head_impl,true);
        _Var3._M_head_impl = local_f8._M_head_impl;
        _Var2._M_head_impl = local_110._M_head_impl;
        local_170[0] = (internal)((X509 *)local_f8._M_head_impl != (X509 *)0x0);
        local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((X509 *)local_f8._M_head_impl == (X509 *)0x0) {
          testing::Message::Message((Message *)&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_150,(internal *)local_170,(AssertionResult *)0x5841ab,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x10c8,local_150._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
LAB_003c33a3:
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
          if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_168,local_168);
          }
        }
        else {
          pEVar6 = EVP_sha256();
          iVar4 = X509_sign((X509 *)_Var3._M_head_impl,(EVP_PKEY *)_Var2._M_head_impl,pEVar6);
          local_170[0] = (internal)(iVar4 != 0);
          local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar4 == 0) {
            testing::Message::Message((Message *)&local_128);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_150,(internal *)local_170,
                       (AssertionResult *)"X509_sign(intermediate.get(), key.get(), EVP_sha256())",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x10c9,local_150._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
            goto LAB_003c33a3;
          }
          MakeTestCert((anon_unknown_dwarf_b3fcdf *)&local_100,"Intermediate","Leaf",
                       local_110._M_head_impl,false);
          _Var3._M_head_impl = local_100._M_head_impl;
          local_170[0] = (internal)((X509 *)local_100._M_head_impl != (X509 *)0x0);
          local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((X509 *)local_100._M_head_impl == (X509 *)0x0) {
            testing::Message::Message((Message *)&local_128);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_150,(internal *)local_170,(AssertionResult *)0x5841e9,"false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x10cd,local_150._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
LAB_003c34b9:
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_168;
            testing::internal::AssertHelper::~AssertHelper(&local_180);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              (*(code *)(*local_128.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_start)->sig_alg)();
            }
            local_178 = local_168;
            if (local_168 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_003c3bf4:
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(this_00,local_178);
            }
          }
          else {
            pEVar6 = EVP_sha256();
            iVar4 = X509_sign((X509 *)_Var3._M_head_impl,(EVP_PKEY *)local_110._M_head_impl,pEVar6);
            _Var3._M_head_impl = local_100._M_head_impl;
            local_170[0] = (internal)(iVar4 != 0);
            local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar4 == 0) {
              testing::Message::Message((Message *)&local_128);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_150,(internal *)local_170,
                         (AssertionResult *)"X509_sign(leaf.get(), key.get(), EVP_sha256())","false"
                         ,"true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_180,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10ce,local_150._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_128);
              goto LAB_003c34b9;
            }
            local_12c = 0;
            local_c8._M_head_impl = local_e8._M_head_impl;
            __l._M_len = 1;
            __l._M_array = &local_c8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_150,__l,&local_151);
            local_d8._M_head_impl = local_f8._M_head_impl;
            __l_00._M_len = 1;
            __l_00._M_array = &local_d8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_170,__l_00,&local_152)
            ;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_38._M_unused._M_object = (void *)0x0;
            local_38._8_8_ = 0;
            local_28 = (code *)0x0;
            uStack_20 = 0;
            local_104 = Verify(_Var3._M_head_impl,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_150,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_170,&local_128
                               ,0,(function<void_(x509_store_ctx_st_*)> *)&local_38);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_180,"0",
                       "Verify(leaf.get(), {root1.get()}, {intermediate.get()}, {})",&local_12c,
                       &local_104);
            if (local_28 != (code *)0x0) {
              (*local_28)(&local_38,&local_38,__destroy_functor);
            }
            pvVar1 = (void *)CONCAT71(local_170._1_7_,local_170[0]);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_160 - (long)pvVar1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_150._M_dataplus._M_p,
                              local_150.field_2._M_allocated_capacity -
                              (long)local_150._M_dataplus._M_p);
            }
            if (local_180.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_150);
              if (local_178 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = (local_178->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10d3,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_170,(Message *)&local_150);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_150._M_dataplus._M_p + 8))();
              }
            }
            if (local_178 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_178,local_178);
            }
            _Var3._M_head_impl = local_100._M_head_impl;
            local_12c = 10;
            local_d8._M_head_impl = local_e0._M_head_impl;
            __l_01._M_len = 1;
            __l_01._M_array = &local_d8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_150,__l_01,&local_151
                      );
            local_c8._M_head_impl = local_f8._M_head_impl;
            local_c0 = (X509 *)local_f0._M_head_impl;
            __l_02._M_len = 2;
            __l_02._M_array = &local_c8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_170,__l_02,&local_152)
            ;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_58._M_unused._M_object = (void *)0x0;
            local_58._8_8_ = 0;
            local_48 = (code *)0x0;
            uStack_40 = 0;
            local_104 = Verify(_Var3._M_head_impl,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_150,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_170,&local_128
                               ,0,(function<void_(x509_store_ctx_st_*)> *)&local_58);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_180,"10",
                       "Verify(leaf.get(), {root2.get()}, {intermediate.get(), root1_cross.get()}, {})"
                       ,&local_12c,&local_104);
            if (local_48 != (code *)0x0) {
              (*local_48)(&local_58,&local_58,__destroy_functor);
            }
            pvVar1 = (void *)CONCAT71(local_170._1_7_,local_170[0]);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_160 - (long)pvVar1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_150._M_dataplus._M_p,
                              local_150.field_2._M_allocated_capacity -
                              (long)local_150._M_dataplus._M_p);
            }
            if (local_180.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_150);
              if (local_178 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = (local_178->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10d6,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_170,(Message *)&local_150);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_150._M_dataplus._M_p + 8))();
              }
            }
            if (local_178 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_178,local_178);
            }
            _Var3._M_head_impl = local_100._M_head_impl;
            local_12c = 0;
            local_c8._M_head_impl = local_e8._M_head_impl;
            local_c0 = (X509 *)local_e0._M_head_impl;
            __l_03._M_len = 2;
            __l_03._M_array = &local_c8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_150,__l_03,&local_151
                      );
            local_d8._M_head_impl = local_f8._M_head_impl;
            local_d0 = (X509 *)local_f0._M_head_impl;
            __l_04._M_len = 2;
            __l_04._M_array = &local_d8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_170,__l_04,&local_152)
            ;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_78._M_unused._M_object = (void *)0x0;
            local_78._8_8_ = 0;
            local_68 = (code *)0x0;
            uStack_60 = 0;
            local_104 = Verify(_Var3._M_head_impl,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_150,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_170,&local_128
                               ,0,(function<void_(x509_store_ctx_st_*)> *)&local_78);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_180,"0",
                       "Verify(leaf.get(), {root1.get(), root2.get()}, {intermediate.get(), root1_cross.get()}, {})"
                       ,&local_12c,&local_104);
            if (local_68 != (code *)0x0) {
              (*local_68)(&local_78,&local_78,__destroy_functor);
            }
            pvVar1 = (void *)CONCAT71(local_170._1_7_,local_170[0]);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_160 - (long)pvVar1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_150._M_dataplus._M_p,
                              local_150.field_2._M_allocated_capacity -
                              (long)local_150._M_dataplus._M_p);
            }
            if (local_180.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_150);
              if (local_178 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = (local_178->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10db,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_170,(Message *)&local_150);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_150._M_dataplus._M_p + 8))();
              }
            }
            if (local_178 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_178,local_178);
            }
            _Var3._M_head_impl = local_100._M_head_impl;
            local_12c = 10;
            local_c8._M_head_impl = local_e8._M_head_impl;
            local_c0 = (X509 *)local_e0._M_head_impl;
            __l_05._M_len = 2;
            __l_05._M_array = &local_c8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_150,__l_05,&local_151
                      );
            local_d8._M_head_impl = local_f8._M_head_impl;
            local_d0 = (X509 *)local_f0._M_head_impl;
            __l_06._M_len = 2;
            __l_06._M_array = &local_d8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_170,__l_06,&local_152)
            ;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_98._M_unused._M_object = (void *)0x0;
            local_98._8_8_ = 0;
            local_80 = std::
                       _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4324:3)>
                       ::_M_invoke;
            local_88 = std::
                       _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4324:3)>
                       ::_M_manager;
            local_104 = Verify(_Var3._M_head_impl,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_150,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_170,&local_128
                               ,0,(function<void_(x509_store_ctx_st_*)> *)&local_98);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_180,"10",
                       "Verify(leaf.get(), {root1.get(), root2.get()}, {intermediate.get(), root1_cross.get()}, {}, 0, [&](X509_STORE_CTX *ctx) { X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx); X509_VERIFY_PARAM_clear_flags(param, 0x8000); })"
                       ,&local_12c,&local_104);
            if (local_88 != (code *)0x0) {
              (*local_88)(&local_98,&local_98,__destroy_functor);
            }
            pvVar1 = (void *)CONCAT71(local_170._1_7_,local_170[0]);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_160 - (long)pvVar1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_150._M_dataplus._M_p,
                              local_150.field_2._M_allocated_capacity -
                              (long)local_150._M_dataplus._M_p);
            }
            if (local_180.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_150);
              if (local_178 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = (local_178->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10eb,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_170,(Message *)&local_150);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_150._M_dataplus._M_p + 8))();
              }
            }
            if (local_178 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_178,local_178);
            }
            local_12c = 0;
            local_d8._M_head_impl = local_e8._M_head_impl;
            __l_07._M_len = 1;
            __l_07._M_array = &local_d8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_150,__l_07,&local_151
                      );
            local_c8._M_head_impl = local_f8._M_head_impl;
            local_c0 = (X509 *)local_f0._M_head_impl;
            __l_08._M_len = 2;
            __l_08._M_array = &local_c8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_170,__l_08,&local_152)
            ;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_b8._M_unused._M_object = (void *)0x0;
            local_b8._8_8_ = 0;
            local_a0 = std::
                       _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4335:3)>
                       ::_M_invoke;
            local_a8 = std::
                       _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4335:3)>
                       ::_M_manager;
            local_104 = Verify(local_100._M_head_impl,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_150,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_170,&local_128
                               ,0,(function<void_(x509_store_ctx_st_*)> *)&local_b8);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_180,"0",
                       "Verify(leaf.get(), {root1.get()}, {intermediate.get(), root1_cross.get()}, {}, 0, [&](X509_STORE_CTX *ctx) { X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx); X509_VERIFY_PARAM_clear_flags(param, 0x8000); })"
                       ,&local_12c,&local_104);
            if (local_a8 != (code *)0x0) {
              (*local_a8)(&local_b8,&local_b8,__destroy_functor);
            }
            pvVar1 = (void *)CONCAT71(local_170._1_7_,local_170[0]);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_160 - (long)pvVar1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_150._M_dataplus._M_p,
                              local_150.field_2._M_allocated_capacity -
                              (long)local_150._M_dataplus._M_p);
            }
            if (local_180.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_150);
              if (local_178 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                message = "";
              }
              else {
                message = (local_178->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10f5,message);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_170,(Message *)&local_150);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_150._M_dataplus._M_p + 8))();
              }
            }
            if (local_178 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_178;
              goto LAB_003c3bf4;
            }
          }
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_100);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_f8);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_f0);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_e8);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_e0);
LAB_003c3c3a:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_110);
  return;
}

Assistant:

TEST(X509Test, TrustedFirst) {
  // Generate the following certificates:
  //
  //                     Root 2 (in store, expired)
  //                       |
  // Root 1 (in store)   Root 1 (cross-sign)
  //          \           /
  //          Intermediate
  //                |
  //               Leaf
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  bssl::UniquePtr<X509> root2 =
      MakeTestCert("Root 2", "Root 2", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root2);
  ASSERT_TRUE(ASN1_TIME_adj(X509_getm_notAfter(root2.get()), kReferenceTime,
                            /*offset_day=*/0,
                            /*offset_sec=*/-1));
  ASSERT_TRUE(X509_sign(root2.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> root1 =
      MakeTestCert("Root 1", "Root 1", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root1);
  ASSERT_TRUE(X509_sign(root1.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> root1_cross =
      MakeTestCert("Root 2", "Root 1", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root1_cross);
  ASSERT_TRUE(X509_sign(root1_cross.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> intermediate =
      MakeTestCert("Root 1", "Intermediate", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(intermediate);
  ASSERT_TRUE(X509_sign(intermediate.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> leaf =
      MakeTestCert("Intermediate", "Leaf", key.get(), /*is_ca=*/false);
  ASSERT_TRUE(leaf);
  ASSERT_TRUE(X509_sign(leaf.get(), key.get(), EVP_sha256()));

  // As a control, confirm that |leaf| -> |intermediate| -> |root1| is valid,
  // but the path through |root1_cross| is expired.
  EXPECT_EQ(X509_V_OK,
            Verify(leaf.get(), {root1.get()}, {intermediate.get()}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_HAS_EXPIRED,
            Verify(leaf.get(), {root2.get()},
                   {intermediate.get(), root1_cross.get()}, {}));

  // By default, we should find the |leaf| -> |intermediate| -> |root2| chain,
  // skipping |root1_cross|.
  EXPECT_EQ(X509_V_OK, Verify(leaf.get(), {root1.get(), root2.get()},
                              {intermediate.get(), root1_cross.get()}, {}));

  // When |X509_V_FLAG_TRUSTED_FIRST| is disabled, we get stuck on the expired
  // intermediate. Note we need the callback to clear the flag. Setting |flags|
  // to zero only skips setting new flags.
  //
  // This test exists to confirm our current behavior, but these modes are just
  // workarounds for not having an actual path-building verifier. If we fix it,
  // this test can be removed.
  EXPECT_EQ(X509_V_ERR_CERT_HAS_EXPIRED,
            Verify(leaf.get(), {root1.get(), root2.get()},
                   {intermediate.get(), root1_cross.get()}, {}, /*flags=*/0,
                   [&](X509_STORE_CTX *ctx) {
                     X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
                     X509_VERIFY_PARAM_clear_flags(param,
                                                   X509_V_FLAG_TRUSTED_FIRST);
                   }));

  // Even when |X509_V_FLAG_TRUSTED_FIRST| is disabled, if |root2| is not
  // trusted, the alt chains logic recovers the path.
  EXPECT_EQ(
      X509_V_OK,
      Verify(leaf.get(), {root1.get()}, {intermediate.get(), root1_cross.get()},
             {}, /*flags=*/0, [&](X509_STORE_CTX *ctx) {
               X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
               X509_VERIFY_PARAM_clear_flags(param, X509_V_FLAG_TRUSTED_FIRST);
             }));
}